

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O0

uint32 __thiscall crnlib::well512::next(well512 *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint32 d;
  uint32 c;
  uint32 b;
  uint32 a;
  well512 *this_local;
  
  uVar1 = this->m_state[this->m_index] ^ this->m_state[this->m_index + 0xd & 0xf];
  uVar2 = uVar1 ^ this->m_state[this->m_index] << 0x10 ^
          this->m_state[this->m_index + 0xd & 0xf] << 0xf;
  uVar3 = this->m_state[this->m_index + 9 & 0xf] >> 0xb ^ this->m_state[this->m_index + 9 & 0xf];
  uVar4 = uVar2 ^ uVar3;
  this->m_state[this->m_index] = uVar4;
  this->m_index = this->m_index + 0xf & 0xf;
  this->m_state[this->m_index] =
       this->m_state[this->m_index] ^ uVar2 ^ uVar4 ^ (uVar4 & 0x6d22169) << 5 ^
       this->m_state[this->m_index] << 2 ^ uVar1 << 0x12 ^ uVar3 << 0x1c;
  return this->m_state[this->m_index];
}

Assistant:

inline uint32 well512::next()
    {
        uint32 a, b, c, d;
        a = m_state[m_index];
        c = m_state[(m_index + 13) & 15];
        b = a ^ c ^ (a << 16) ^ (c << 15);
        c = m_state[(m_index + 9) & 15];
        c ^= (c >> 11);
        a = m_state[m_index] = b ^ c;
        d = a ^ ((a << 5) & 0xDA442D20UL);
        m_index = (m_index + 15) & 15;
        a = m_state[m_index];
        m_state[m_index] = a ^ b ^ d ^ (a << 2) ^ (b << 18) ^ (c << 28);
        return m_state[m_index];
    }